

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportTag
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index tag_index,Index sig_index)

{
  char *pcVar1;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar2;
  Module *this_00;
  Offset OVar3;
  undefined8 *puVar4;
  size_t sVar5;
  Location loc;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_a0;
  Location local_98;
  Var local_78;
  
  puVar4 = (undefined8 *)operator_new(0x160);
  puVar4[1] = puVar4 + 3;
  puVar4[2] = 0;
  *(undefined1 *)(puVar4 + 3) = 0;
  puVar4[5] = puVar4 + 7;
  puVar4[6] = 0;
  *(undefined1 *)(puVar4 + 7) = 0;
  *(undefined4 *)(puVar4 + 9) = 4;
  *puVar4 = &PTR__TagImport_0019caa8;
  Tag::Tag((Tag *)(puVar4 + 10),(string_view)ZEXT816(0));
  std::__cxx11::string::_M_replace
            ((ulong)(puVar4 + 1),0,(char *)puVar4[2],(ulong)module_name._M_str);
  std::__cxx11::string::_M_replace((ulong)(puVar4 + 5),0,(char *)puVar4[6],(ulong)field_name._M_str)
  ;
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = strlen(pcVar1);
  local_98.filename._M_str = pcVar1;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_78,sig_index,&local_98);
  SetFuncDeclaration(this,(FuncDeclaration *)(puVar4 + 0xe),&local_78);
  Var::~Var(&local_78);
  this_00 = this->module_;
  pcVar1 = this->filename_;
  OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar5 = strlen(pcVar1);
  local_a0._M_t.
  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       operator_new(0x48);
  *(long *)((long)local_a0._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_a0._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_a0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) = sVar5;
  *(char **)((long)local_a0._M_t.
                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20) =
       pcVar1;
  *(Offset *)
   ((long)local_a0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28) = OVar3;
  *(undefined4 *)
   ((long)local_a0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_a0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
  *(undefined ***)
   local_a0._M_t.
   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
   super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       &PTR__ImportModuleField_0019cb28;
  *(undefined8 **)
   ((long)local_a0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) = puVar4;
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
      local_a0._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
      (ImportModuleField *)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportTag(Index import_index,
                                   std::string_view module_name,
                                   std::string_view field_name,
                                   Index tag_index,
                                   Index sig_index) {
  auto import = std::make_unique<TagImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  SetFuncDeclaration(&import->tag.decl, Var(sig_index, GetLocation()));
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}